

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O3

bool ON_ClampKnotVector(int order,int cv_count,double *knot,int end)

{
  double dVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar9;
  
  auVar2 = _DAT_0069b120;
  bVar6 = false;
  if (((order <= cv_count) && (bVar6 = false, 1 < order)) && (knot != (double *)0x0)) {
    bVar6 = (end & 0xfffffffdU) == 0;
    if (2 < (uint)order && bVar6) {
      dVar1 = knot[order - 2];
      lVar5 = (ulong)(order - 2) - 1;
      auVar7._8_4_ = (int)lVar5;
      auVar7._0_8_ = lVar5;
      auVar7._12_4_ = (int)((ulong)lVar5 >> 0x20);
      lVar5 = 0;
      auVar7 = auVar7 ^ _DAT_0069b120;
      auVar8 = _DAT_0069b170;
      do {
        auVar11 = auVar8 ^ auVar2;
        if ((bool)(~(auVar11._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar11._0_4_ ||
                    auVar7._4_4_ < auVar11._4_4_) & 1)) {
          *(double *)((long)knot + lVar5) = dVar1;
        }
        if ((auVar11._12_4_ != auVar7._12_4_ || auVar11._8_4_ <= auVar7._8_4_) &&
            auVar11._12_4_ <= auVar7._12_4_) {
          *(double *)((long)knot + lVar5 + 8) = dVar1;
        }
        lVar9 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 2;
        auVar8._8_8_ = lVar9 + 2;
        lVar5 = lVar5 + 0x10;
      } while ((ulong)(order - 1U >> 1) << 4 != lVar5);
    }
    auVar8 = _DAT_0069b170;
    auVar2 = _DAT_0069b120;
    if ((end - 1U < 2) && (bVar6 = true, cv_count < order + cv_count + -2)) {
      dVar1 = knot[(long)cv_count + -1];
      uVar4 = order - 3;
      auVar11._4_4_ = 0;
      auVar11._0_4_ = uVar4;
      auVar11._8_4_ = uVar4;
      auVar11._12_4_ = 0;
      uVar3 = 0;
      auVar11 = auVar11 ^ _DAT_0069b120;
      do {
        auVar10._8_4_ = (int)uVar3;
        auVar10._0_8_ = uVar3;
        auVar10._12_4_ = (int)(uVar3 >> 0x20);
        auVar7 = (auVar10 | auVar8) ^ auVar2;
        if ((bool)(~(auVar7._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar7._0_4_ ||
                    auVar11._4_4_ < auVar7._4_4_) & 1)) {
          knot[(uint)cv_count + uVar3] = dVar1;
        }
        if ((auVar7._12_4_ != auVar11._12_4_ || auVar7._8_4_ <= auVar11._8_4_) &&
            auVar7._12_4_ <= auVar11._12_4_) {
          knot[(ulong)(uint)cv_count + uVar3 + 1] = dVar1;
        }
        uVar3 = uVar3 + 2;
      } while (((ulong)uVar4 + 2 & 0xfffffffffffffffe) != uVar3);
    }
  }
  return bVar6;
}

Assistant:

bool ON_ClampKnotVector(
          int order,          // order (>=2)
          int cv_count,       // cv count
          double* knot,       // knot[] array
          int end             // 0 = clamp start, 1 = clamp end, 2 = clamp both ends
          )
{
  // sets initial/final order-2 knot values to match knot[order-2]/knot[cv_count-1]
  bool rc = false;
  int i, i0;
  if ( knot && order >= 2 && cv_count >= order ) {
    if ( end == 0 || end == 2 ) {
      i0 = order-2;
      for ( i = 0; i < i0; i++ ) {
        knot[i] = knot[i0];
      }
      rc = true;
    }
    if ( end == 1 || end == 2 ) {
      const int knot_count = ON_KnotCount(order,cv_count);
      i0 = cv_count-1;
      for ( i = i0+1; i < knot_count; i++ ) {
        knot[i] = knot[i0];
      }
      rc = true;
    }
  }
  return rc;
}